

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

void x86ReserveLabels(uint count)

{
  uchar **ppuVar1;
  
  ppuVar1 = labels.data;
  if (labels.max <= count) {
    FastVector<unsigned_char_*,_false,_false>::grow_no_destroy(&labels,count);
    if (ppuVar1 != (uchar **)0x0) {
      (*(code *)NULLC::dealloc)(ppuVar1);
    }
  }
  labels.count = count;
  return;
}

Assistant:

void x86ReserveLabels(unsigned int count)
{
	labels.resize(count);
}